

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
flatbuffers::ResizeContext::ResizeTable(ResizeContext *this,Object *objectdef,Table *table)

{
  ResizeContext *table_00;
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint16_t uVar4;
  BaseType BVar5;
  return_type rVar6;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar7;
  Type *pTVar8;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar9;
  char *pcVar10;
  ResizeContext *pRVar11;
  int __c;
  int __c_00;
  Table *pTVar12;
  ulong uVar13;
  ResizeContext *__s;
  ResizeContext *__s_00;
  Table *pTVar14;
  uint8_t *offset_location;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar15;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *this_00;
  ResizeContext *local_68;
  
  if ((this->dag_check_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start
      [(long)table -
       (long)(this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
             .super__Vector_impl_data._M_start >> 2] != '\0') {
    return;
  }
  iVar1 = *(int *)table;
  pTVar12 = table;
  pTVar14 = table + -(long)iVar1;
  if (table < (Table *)this->startptr_) {
    __s = (ResizeContext *)objectdef;
    pVVar7 = reflection::Object::fields(objectdef);
    for (pVVar15 = pVVar7 + 4; pTVar12 = table + -(long)iVar1, pTVar14 = table,
        pVVar15 != pVVar7 + 4 + (uint)(*(int *)pVVar7 << 2); pVVar15 = pVVar15 + 4) {
      this_00 = pVVar15 + *(uint *)pVVar15;
      pTVar8 = reflection::Field::type((Field *)this_00);
      BVar5 = reflection::Type::base_type(pTVar8);
      if (0xc < (int)BVar5) {
        uVar4 = reflection::Field::offset((Field *)this_00);
        if ((uVar4 < *(ushort *)(table + -(long)*(int *)table)) &&
           (uVar13 = (ulong)*(ushort *)(table + ((ulong)uVar4 - (long)*(int *)table)), uVar13 != 0))
        {
          bVar3 = true;
          if (BVar5 == Obj) {
            pVVar9 = reflection::Schema::objects(this->schema_);
            pTVar8 = reflection::Field::type((Field *)this_00);
            pcVar10 = reflection::Type::index(pTVar8,(char *)__s,__c);
            __s = (ResizeContext *)((ulong)pcVar10 & 0xffffffff);
            pRVar11 = (ResizeContext *)
                      Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                                (pVVar9,(uint)pcVar10);
            if (pRVar11 == (ResizeContext *)0x0) {
              pRVar11 = (ResizeContext *)0x0;
            }
            else {
              bVar3 = reflection::Object::is_struct((Object *)pRVar11);
              if (bVar3) goto switchD_0014bf18_caseD_d;
              bVar3 = false;
            }
          }
          else {
            pRVar11 = (ResizeContext *)0x0;
          }
          __s_00 = (ResizeContext *)(table + uVar13);
          __s = this;
          if ((this->dag_check_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start
              [(long)__s_00 -
               (long)(this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 2] == '\0') {
            uVar2 = *(uint *)&__s_00->schema_;
            table_00 = (ResizeContext *)((long)&__s_00->schema_ + (ulong)uVar2);
            Straddle<unsigned_int,1>(this,__s_00,table_00,__s_00);
            __s = __s_00;
            switch(BVar5) {
            case String:
              break;
            case Vector:
              pTVar8 = reflection::Field::type((Field *)this_00);
              BVar5 = reflection::Type::element(pTVar8);
              __s = __s_00;
              if ((BVar5 & ~Bool) == String) {
                bVar3 = true;
                if (BVar5 == Obj) {
                  pVVar9 = reflection::Schema::objects(this->schema_);
                  pTVar8 = reflection::Field::type((Field *)this_00);
                  pcVar10 = reflection::Type::index(pTVar8,(char *)__s_00,__c_00);
                  __s = (ResizeContext *)((ulong)pcVar10 & 0xffffffff);
                  local_68 = (ResizeContext *)
                             Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                                       (pVVar9,(uint)pcVar10);
                  if (local_68 == (ResizeContext *)0x0) {
                    local_68 = (ResizeContext *)0x0;
                  }
                  else {
                    bVar3 = reflection::Object::is_struct((Object *)local_68);
                    if (bVar3) break;
                    bVar3 = false;
                  }
                }
                else {
                  local_68 = (ResizeContext *)0x0;
                }
                pTVar12 = table + (ulong)uVar2 + uVar13 + 4;
                pRVar11 = table_00;
                for (uVar13 = 0; pRVar11 = (ResizeContext *)((long)&pRVar11->schema_ + 4),
                    uVar13 < *(uint *)&table_00->schema_; uVar13 = uVar13 + 1) {
                  if ((this->dag_check_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [(long)pTVar12 -
                       (long)(this->buf_->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 2] == '\0') {
                    rVar6 = Vector<unsigned_int,_unsigned_int>::Get
                                      ((Vector<unsigned_int,_unsigned_int> *)table_00,(uint)uVar13);
                    pTVar14 = (Table *)((long)&pRVar11->schema_ + (ulong)rVar6);
                    __s = pRVar11;
                    Straddle<unsigned_int,1>(this,pRVar11,pTVar14,pRVar11);
                    if (!bVar3) {
                      __s = local_68;
                      ResizeTable(this,(Object *)local_68,pTVar14);
                    }
                  }
                  pTVar12 = pTVar12 + 4;
                }
              }
              break;
            case Obj:
              if (!bVar3) goto LAB_0014bfc3;
              break;
            case Union:
              pRVar11 = (ResizeContext *)
                        GetUnionType(this->schema_,objectdef,(Field *)this_00,table);
LAB_0014bfc3:
              ResizeTable(this,(Object *)pRVar11,(Table *)table_00);
              __s = pRVar11;
              break;
            default:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                            ,0x221,
                            "void flatbuffers::ResizeContext::ResizeTable(const reflection::Object &, Table *)"
                           );
            }
          }
        }
      }
switchD_0014bf18_caseD_d:
    }
  }
  Straddle<int,_1>(this,pTVar14,pTVar12,table);
  return;
}

Assistant:

uint8_t &DagCheck(const void *offsetloc) {
    auto dag_idx = reinterpret_cast<const uoffset_t *>(offsetloc) -
                   reinterpret_cast<const uoffset_t *>(buf_.data());
    return dag_check_[dag_idx];
  }